

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse2.h
# Opt level: O0

void store_rect_16bit_to_32bit(__m128i a,int32_t *b)

{
  int in_EDX;
  longlong in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i a_00;
  __m128i alVar1;
  __m128i b_hi;
  __m128i b_lo;
  __m128i a_hi;
  __m128i a_lo;
  __m128i one;
  
  alVar1[1] = in_RSI;
  alVar1[0] = 0x16a1;
  alVar1 = scale_round_sse2(alVar1,in_EDX);
  a_00[1] = in_RSI;
  a_00[0] = 0x16a1;
  scale_round_sse2(a_00,(int)alVar1[1]);
  *in_RDI = extraout_XMM0_Qa;
  in_RDI[1] = extraout_XMM0_Qb;
  in_RDI[2] = extraout_XMM0_Qa_00;
  in_RDI[3] = extraout_XMM0_Qb_00;
  return;
}

Assistant:

static inline void store_rect_16bit_to_32bit(const __m128i a,
                                             int32_t *const b) {
  const __m128i one = _mm_set1_epi16(1);
  const __m128i a_lo = _mm_unpacklo_epi16(a, one);
  const __m128i a_hi = _mm_unpackhi_epi16(a, one);
  const __m128i b_lo = scale_round_sse2(a_lo, NewSqrt2);
  const __m128i b_hi = scale_round_sse2(a_hi, NewSqrt2);
  _mm_store_si128((__m128i *)b, b_lo);
  _mm_store_si128((__m128i *)(b + 4), b_hi);
}